

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
          (Printer *this,char *begin_varname,char *end_varname,FieldDescriptor *descriptor)

{
  FileDescriptor *this_00;
  FieldDescriptor *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> path;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  FieldDescriptor *in_stack_ffffffffffffffd0;
  
  if (in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x48c1bd);
    FieldDescriptor::GetLocationPath(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this_00 = FieldDescriptor::file(in_RCX);
    FileDescriptor::name_abi_cxx11_(this_00);
    Annotate((Printer *)end_varname,(char *)descriptor,
             (char *)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
             (string *)
             path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (vector<int,_std::allocator<int>_> *)
             path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
    std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  }
  return;
}

Assistant:

void Annotate(const char* begin_varname, const char* end_varname,
                const SomeDescriptor* descriptor) {
    if (annotation_collector_ == NULL) {
      // Annotations aren't turned on for this Printer, so don't pay the cost
      // of building the location path.
      return;
    }
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    Annotate(begin_varname, end_varname, descriptor->file()->name(), path);
  }